

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_value_objectwriter.cc
# Opt level: O2

void __thiscall
google::protobuf::util::converter::DefaultValueObjectWriter::~DefaultValueObjectWriter
          (DefaultValueObjectWriter *this)

{
  (this->super_ObjectWriter)._vptr_ObjectWriter =
       (_func_int **)&PTR__DefaultValueObjectWriter_003e3b18;
  if ((this->own_typeinfo_ == true) && (this->typeinfo_ != (TypeInfo *)0x0)) {
    (*this->typeinfo_->_vptr_TypeInfo[1])();
  }
  std::_Function_base::~_Function_base(&(this->field_scrub_callback_).super__Function_base);
  std::
  _Deque_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
  ::~_Deque_base((_Deque_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                  *)&this->stack_);
  std::
  unique_ptr<google::protobuf::util::converter::DefaultValueObjectWriter::Node,_std::default_delete<google::protobuf::util::converter::DefaultValueObjectWriter::Node>_>
  ::~unique_ptr(&this->root_);
  std::
  vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&this->string_values_);
  return;
}

Assistant:

DefaultValueObjectWriter::~DefaultValueObjectWriter() {
  if (own_typeinfo_) {
    delete typeinfo_;
  }
}